

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void FindActions(lemon *lemp)

{
  state *psVar1;
  int iVar2;
  action *paVar3;
  bool bVar4;
  action *local_50;
  action *ap_1;
  action *nap;
  action *ap;
  rule *rp;
  symbol *sp;
  state *stp;
  config *cfp;
  int j;
  int i;
  lemon *lemp_local;
  
  for (cfp._4_4_ = 0; cfp._4_4_ < lemp->nstate; cfp._4_4_ = cfp._4_4_ + 1) {
    psVar1 = lemp->sorted[cfp._4_4_];
    for (stp = (state *)psVar1->cfp; stp != (state *)0x0; stp = (state *)stp->pDfltReduce) {
      if (*(int *)&stp->bp->fplp == *(int *)&stp->cfp) {
        for (cfp._0_4_ = 0; (int)cfp < lemp->nterminal; cfp._0_4_ = (int)cfp + 1) {
          if (*(char *)(*(long *)&stp->statenum + (long)(int)cfp) != '\0') {
            Action_add(&psVar1->ap,REDUCE,lemp->symbols[(int)cfp],(char *)stp->bp);
          }
        }
      }
    }
  }
  if (lemp->start == (char *)0x0) {
    rp = (rule *)lemp->startRule->lhs;
  }
  else {
    rp = (rule *)Symbol_find(lemp->start);
    if (rp == (rule *)0x0) {
      if (lemp->startRule == (rule *)0x0) {
        fprintf(_stderr,"internal error on source line %d: no start rule\n",0x4e5);
        exit(1);
      }
      rp = (rule *)lemp->startRule->lhs;
    }
  }
  Action_add(&(*lemp->sorted)->ap,ACCEPT,(symbol *)rp,(char *)0x0);
  for (cfp._4_4_ = 0; cfp._4_4_ < lemp->nstate; cfp._4_4_ = cfp._4_4_ + 1) {
    psVar1 = lemp->sorted[cfp._4_4_];
    paVar3 = Action_sort(psVar1->ap);
    psVar1->ap = paVar3;
    nap = psVar1->ap;
    while( true ) {
      bVar4 = false;
      if (nap != (action *)0x0) {
        bVar4 = nap->next != (action *)0x0;
      }
      if (!bVar4) break;
      ap_1 = nap->next;
      while( true ) {
        bVar4 = false;
        if (ap_1 != (action *)0x0) {
          bVar4 = ap_1->sp == nap->sp;
        }
        if (!bVar4) break;
        iVar2 = resolve_conflict(nap,ap_1);
        lemp->nconflict = iVar2 + lemp->nconflict;
        ap_1 = ap_1->next;
      }
      nap = nap->next;
    }
  }
  for (ap = (action *)lemp->rule; ap != (action *)0x0; ap = *(action **)&ap[3].type) {
    *(undefined4 *)&ap[2].spOpt = 0;
  }
  for (cfp._4_4_ = 0; cfp._4_4_ < lemp->nstate; cfp._4_4_ = cfp._4_4_ + 1) {
    for (local_50 = lemp->sorted[cfp._4_4_]->ap; local_50 != (action *)0x0;
        local_50 = local_50->next) {
      if (local_50->type == REDUCE) {
        ((local_50->x).rp)->canReduce = LEMON_TRUE;
      }
    }
  }
  for (ap = (action *)lemp->rule; ap != (action *)0x0; ap = *(action **)&ap[3].type) {
    if (*(int *)&ap[2].spOpt == 0) {
      ErrorMsg(lemp->filename,*(int *)((long)&ap->x + 4),"This rule can not be reduced.\n");
      lemp->errorcnt = lemp->errorcnt + 1;
    }
  }
  return;
}

Assistant:

void FindActions(struct lemon *lemp)
{
  int i,j;
  struct config *cfp;
  struct state *stp;
  struct symbol *sp;
  struct rule *rp;

  /* Add all of the reduce actions
  ** A reduce action is added for each element of the followset of
  ** a configuration which has its dot at the extreme right.
  */
  for(i=0; i<lemp->nstate; i++){   /* Loop over all states */
    stp = lemp->sorted[i];
    for(cfp=stp->cfp; cfp; cfp=cfp->next){  /* Loop over all configurations */
      if( cfp->rp->nrhs==cfp->dot ){        /* Is dot at extreme right? */
        for(j=0; j<lemp->nterminal; j++){
          if( SetFind(cfp->fws,j) ){
            /* Add a reduce action to the state "stp" which will reduce by the
            ** rule "cfp->rp" if the lookahead symbol is "lemp->symbols[j]" */
            Action_add(&stp->ap,REDUCE,lemp->symbols[j],(char *)cfp->rp);
          }
        }
      }
    }
  }

  /* Add the accepting token */
  if( lemp->start ){
    sp = Symbol_find(lemp->start);
    if( sp==0 ){
      if( lemp->startRule==0 ){
        fprintf(stderr, "internal error on source line %d: no start rule\n",
                __LINE__);
        exit(1);
      }
      sp = lemp->startRule->lhs;
    }
  }else{
    sp = lemp->startRule->lhs;
  }
  /* Add to the first state (which is always the starting state of the
  ** finite state machine) an action to ACCEPT if the lookahead is the
  ** start nonterminal.  */
  Action_add(&lemp->sorted[0]->ap,ACCEPT,sp,0);

  /* Resolve conflicts */
  for(i=0; i<lemp->nstate; i++){
    struct action *ap, *nap;
    stp = lemp->sorted[i];
    /* assert( stp->ap ); */
    stp->ap = Action_sort(stp->ap);
    for(ap=stp->ap; ap && ap->next; ap=ap->next){
      for(nap=ap->next; nap && nap->sp==ap->sp; nap=nap->next){
         /* The two actions "ap" and "nap" have the same lookahead.
         ** Figure out which one should be used */
         lemp->nconflict += resolve_conflict(ap,nap);
      }
    }
  }

  /* Report an error for each rule that can never be reduced. */
  for(rp=lemp->rule; rp; rp=rp->next) rp->canReduce = LEMON_FALSE;
  for(i=0; i<lemp->nstate; i++){
    struct action *ap;
    for(ap=lemp->sorted[i]->ap; ap; ap=ap->next){
      if( ap->type==REDUCE ) ap->x.rp->canReduce = LEMON_TRUE;
    }
  }
  for(rp=lemp->rule; rp; rp=rp->next){
    if( rp->canReduce ) continue;
    ErrorMsg(lemp->filename,rp->ruleline,"This rule can not be reduced.\n");
    lemp->errorcnt++;
  }
}